

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.cc
# Opt level: O0

void brotli::EmitLongInsertLen
               (size_t insertlen,uint8_t *depth,uint16_t *bits,uint32_t *histo,size_t *storage_ix,
               uint8_t *storage)

{
  uint8_t *storage_local;
  size_t *storage_ix_local;
  uint32_t *histo_local;
  uint16_t *bits_local;
  uint8_t *depth_local;
  size_t insertlen_local;
  
  if (insertlen < 0x5842) {
    WriteBits((ulong)depth[0x3e],(ulong)bits[0x3e],storage_ix,storage);
    WriteBits(0xe,insertlen - 0x1842,storage_ix,storage);
    histo[0x16] = histo[0x16] + 1;
  }
  else {
    WriteBits((ulong)depth[0x3f],(ulong)bits[0x3f],storage_ix,storage);
    WriteBits(0x18,insertlen - 0x5842,storage_ix,storage);
    histo[0x17] = histo[0x17] + 1;
  }
  return;
}

Assistant:

inline void EmitLongInsertLen(size_t insertlen,
                              const uint8_t depth[128],
                              const uint16_t bits[128],
                              uint32_t histo[128],
                              size_t* storage_ix,
                              uint8_t* storage) {
  if (insertlen < 22594) {
    WriteBits(depth[62], bits[62], storage_ix, storage);
    WriteBits(14, insertlen - 6210, storage_ix, storage);
    ++histo[22];
  } else {
    WriteBits(depth[63], bits[63], storage_ix, storage);
    WriteBits(24, insertlen - 22594, storage_ix, storage);
    ++histo[23];
  }
}